

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberparsing.h
# Opt level: O0

bool parse_float(uint8_t *buf,ParsedJson *pj,uint32_t offset,bool found_minus)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  byte in_CL;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  bool bVar6;
  double d;
  int exponent;
  int64_t expnumber;
  uchar digit_3;
  bool negexp;
  uchar digit_2;
  uchar digit_1;
  double fractionalweight;
  uchar digit;
  double i;
  bool negative;
  char *p;
  double local_a8;
  uint local_a0;
  double local_78;
  double local_68;
  byte *local_58;
  bool local_32;
  
  local_58 = (byte *)(in_RDI + (ulong)in_EDX);
  bVar6 = (in_CL & 1) != 0;
  if (bVar6) {
    local_58 = local_58 + 1;
  }
  if (*local_58 == 0x30) {
    local_58 = local_58 + 1;
    local_68 = 0.0;
  }
  else {
    local_68 = (double)(byte)(*local_58 - 0x30);
    while( true ) {
      local_58 = local_58 + 1;
      bVar3 = is_integer(*local_58);
      if (!bVar3) break;
      local_68 = local_68 * 10.0 + (double)(byte)(*local_58 - 0x30);
    }
  }
  if (*local_58 == 0x2e) {
    pbVar5 = local_58 + 1;
    bVar3 = is_integer(*pbVar5);
    if (!bVar3) {
      return false;
    }
    local_58 = local_58 + 2;
    local_78 = 0.1;
    local_68 = (double)(byte)(*pbVar5 - 0x30) * 0.1 + local_68;
    while (bVar3 = is_integer(*local_58), bVar3) {
      bVar1 = *local_58;
      local_58 = local_58 + 1;
      local_78 = local_78 * 0.1;
      local_68 = (double)(byte)(bVar1 - 0x30) * local_78 + local_68;
    }
  }
  if ((*local_58 == 0x65) || (*local_58 == 0x45)) {
    pbVar5 = local_58 + 1;
    bVar3 = false;
    if (*pbVar5 == 0x2d) {
      bVar3 = true;
      pbVar5 = local_58 + 2;
    }
    else if (*pbVar5 == 0x2b) {
      pbVar5 = local_58 + 2;
    }
    local_58 = pbVar5;
    bVar4 = is_integer(*local_58);
    if (!bVar4) {
      return false;
    }
    local_a0 = (uint)(byte)(*local_58 - 0x30);
    pbVar5 = local_58 + 1;
    bVar4 = is_integer(*pbVar5);
    if (bVar4) {
      local_a0 = local_a0 * 10 + (uint)(byte)(*pbVar5 - 0x30);
      pbVar5 = local_58 + 2;
    }
    local_58 = pbVar5;
    bVar4 = is_integer(*local_58);
    if (bVar4) {
      local_a0 = local_a0 * 10 + (uint)(byte)(*local_58 - 0x30);
      local_58 = local_58 + 1;
    }
    bVar4 = is_integer(*local_58);
    if (bVar4) {
      local_a0 = local_a0 * 10 + (uint)(byte)(*local_58 - 0x30);
      local_58 = local_58 + 1;
    }
    bVar4 = is_integer(*local_58);
    if (bVar4) {
      return false;
    }
    if (bVar3) {
      local_a0 = -local_a0;
    }
    if ((0x134 < (int)local_a0) || ((int)local_a0 < -0x134)) {
      return false;
    }
    local_68 = power_of_ten[(int)(local_a0 + 0x134)] * local_68;
  }
  if (structural_or_whitespace_negated[*local_58] == 0) {
    if (bVar6) {
      local_a8 = -local_68;
    }
    else {
      local_a8 = local_68;
    }
    uVar2 = *(uint *)(in_RSI + 0x20);
    *(uint *)(in_RSI + 0x20) = uVar2 + 1;
    *(undefined8 *)(*(long *)(in_RSI + 0x30) + (ulong)uVar2 * 8) = 0x6400000000000000;
    uVar2 = *(uint *)(in_RSI + 0x20);
    *(uint *)(in_RSI + 0x20) = uVar2 + 1;
    *(double *)(*(long *)(in_RSI + 0x30) + (ulong)uVar2 * 8) = local_a8;
    local_32 = structural_or_whitespace[*local_58] != 0;
  }
  else {
    local_32 = false;
  }
  return local_32;
}

Assistant:

static never_inline bool
parse_float(const uint8_t *const buf,
                          ParsedJson &pj, const uint32_t offset,
                          bool found_minus) {
  const char *p = reinterpret_cast<const char *>(buf + offset);
  bool negative = false;
  if (found_minus) {
    ++p;
    negative = true;
  }
  double i;
  if (*p == '0') { // 0 cannot be followed by an integer
    ++p;
    i = 0;
  } else {
    unsigned char digit = *p - '0';
    i = digit;
    p++;
    while (is_integer(*p)) {
      digit = *p - '0';
      i = 10 * i + digit;
      ++p;
    }
  }
  if ('.' == *p) {
    ++p;
    double fractionalweight = 1;
    if(is_integer(*p)) {
      unsigned char digit = *p - '0';
      ++p;
      fractionalweight *= 0.1;
      i = i + digit * fractionalweight;
    } else {
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    while (is_integer(*p)) {
      unsigned char digit = *p - '0';
      ++p;
      fractionalweight *= 0.1;
      i = i + digit * fractionalweight;
    }
  }
  if (('e' == *p) || ('E' == *p)) {
    ++p;
    bool negexp = false;
    if ('-' == *p) {
      negexp = true;
      ++p;
    } else if ('+' == *p) {
      ++p;
    }
    if (!is_integer(*p)) {
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    unsigned char digit = *p - '0';
    int64_t expnumber = digit; // exponential part
    p++;
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
// we refuse to parse this
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    int exponent = (negexp ? -expnumber : expnumber);
    if ((exponent > 308) || (exponent < -308)) {
// we refuse to parse this
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    i *= power_of_ten[308 + exponent];
  }
  if(is_not_structural_or_whitespace(*p)) {
    return false;
  }
  double d = negative ? -i : i;
  pj.write_tape_double(d);
#ifdef JSON_TEST_NUMBERS // for unit testing
  foundFloat(d, buf + offset);
#endif
  return is_structural_or_whitespace(*p);
}